

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MatchResultListener * __thiscall
testing::MatchResultListener::operator<<(MatchResultListener *this,char **x)

{
  undefined8 *in_RSI;
  MatchResultListener *in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    std::operator<<(*(ostream **)(in_RDI + 8),(char *)*in_RSI);
  }
  return in_RDI;
}

Assistant:

MatchResultListener& operator<<(const T& x) {
    if (stream_ != NULL)
      *stream_ << x;
    return *this;
  }